

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O3

bool __thiscall idx2::path::operator==(path *this,path *Other)

{
  bool bVar1;
  long lVar2;
  path *Lhs;
  
  if (this->NParts != Other->NParts) {
    return false;
  }
  if (this->NParts < 1) {
    return true;
  }
  lVar2 = 0;
  Lhs = this;
  do {
    bVar1 = operator!=(Lhs->Parts,Other->Parts);
    if (bVar1) break;
    lVar2 = lVar2 + 1;
    Other = (path *)(&Other->Parts[0].field_0 + 2);
    Lhs = (path *)(Lhs->Parts + 1);
  } while (lVar2 < this->NParts);
  return !bVar1;
}

Assistant:

bool
path::operator==(const path& Other) const
{
  if (this->NParts != Other.NParts)
    return false;
  for (int I = 0; I < this->NParts; ++I)
  {
    if (this->Parts[I] != Other.Parts[I])
      return false;
  }
  return true;
}